

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O0

bool __thiscall
Clasp::Solver::postPropagate(Solver *this,PostPropagator **start,PostPropagator *stop)

{
  long *plVar1;
  ulong uVar2;
  long in_RDX;
  long *in_RSI;
  undefined8 in_RDI;
  PostPropagator *t;
  PostPropagator **r;
  long *local_28;
  
  local_28 = in_RSI;
  while( true ) {
    if (*local_28 == in_RDX) {
      return true;
    }
    plVar1 = (long *)*local_28;
    uVar2 = (**(code **)(*plVar1 + 0xa0))(plVar1,in_RDI,in_RDX);
    if ((uVar2 & 1) == 0) break;
    if (plVar1 == (long *)*local_28) {
      local_28 = plVar1 + 1;
    }
  }
  return false;
}

Assistant:

bool Solver::postPropagate(PostPropagator** start, PostPropagator* stop) {
	for (PostPropagator** r = start, *t; *r != stop;) {
		t = *r;
		if (!t->propagateFixpoint(*this, stop)) { return false; }
		assert(queueSize() == 0);
		if (t == *r) { r = &t->next; }
		// else: t was removed during propagate
	}
	return true;
}